

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_http.c
# Opt level: O0

void mk_http_request_free_list(mk_http_session *cs,mk_server *server)

{
  mk_list **sr;
  mk_list *__mptr;
  mk_http_request *request;
  mk_list *tmp;
  mk_list *head;
  mk_server *server_local;
  mk_http_session *cs_local;
  
  tmp = (cs->request_list).next;
  request = (mk_http_request *)tmp->next;
  while (tmp != &cs->request_list) {
    sr = &tmp[-0x3f].next;
    mk_list_del(tmp);
    mk_http_request_free((mk_http_request *)sr,server);
    if ((mk_http_request *)sr != &cs->sr_fixed) {
      mk_mem_free(sr);
    }
    tmp = (mk_list *)request;
    request = *(mk_http_request **)&request->user_home;
  }
  return;
}

Assistant:

void mk_http_request_free_list(struct mk_http_session *cs,
                               struct mk_server *server)
{
    struct mk_list *head, *tmp;
    struct mk_http_request *request;

    /* sr = last node */
    MK_TRACE("[FD %i] Free struct client_session", cs->socket);
    mk_list_foreach_safe(head, tmp, &cs->request_list) {
        request = mk_list_entry(head, struct mk_http_request, _head);
        mk_list_del(&request->_head);

        mk_http_request_free(request, server);
        if (request != &cs->sr_fixed) {
            mk_mem_free(request);
        }
    }
}